

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# datastructure.h
# Opt level: O0

void __thiscall
CardStyle::CardStyle
          (CardStyle *this,Type t,int d,multiset<char,_std::less<char>,_std::allocator<char>_> *p,
          int l,int c)

{
  undefined4 in_EDX;
  undefined4 in_ESI;
  multiset<char,_std::less<char>,_std::allocator<char>_> *in_RDI;
  _Rb_tree_color in_R8D;
  undefined4 in_R9D;
  _Base_ptr *this_00;
  
  this_00 = &(in_RDI->_M_t)._M_impl.super__Rb_tree_header._M_header._M_parent;
  std::multiset<char,_std::less<char>,_std::allocator<char>_>::multiset
            ((multiset<char,_std::less<char>,_std::allocator<char>_> *)0x12509c);
  *(undefined4 *)&(in_RDI->_M_t)._M_impl = in_ESI;
  *(undefined4 *)&(in_RDI->_M_t)._M_impl.field_0x4 = in_EDX;
  std::multiset<char,_std::less<char>,_std::allocator<char>_>::operator=
            ((multiset<char,_std::less<char>,_std::allocator<char>_> *)this_00,in_RDI);
  (in_RDI->_M_t)._M_impl.super__Rb_tree_header._M_header._M_color = in_R8D;
  *(undefined4 *)&(in_RDI->_M_t)._M_impl.super__Rb_tree_header._M_header.field_0x4 = in_R9D;
  return;
}

Assistant:

CardStyle(Type t = PASS, int d = 0, std::multiset<byte> p=std::multiset<byte>(), int l = 1, int c = 0) {
        type = t;
        id = d;
        pattern = p;
        len = l;
        carry = c;
    }